

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

Result<VkQueue_T_*> * __thiscall
vkb::Device::get_queue(Result<VkQueue_T_*> *__return_storage_ptr__,Device *this,QueueType type)

{
  PFN_vkGetDeviceQueue p_Var1;
  VkDevice pVVar2;
  uint *puVar3;
  error_code eVar4;
  Result<unsigned_int> index;
  Result<unsigned_int> RStack_38;
  
  get_queue_index(&RStack_38,this,type);
  if (RStack_38.m_init == false) {
    eVar4 = Result<unsigned_int>::error(&RStack_38);
    (__return_storage_ptr__->field_0).m_error.type._M_value = eVar4._M_value;
    *(error_category **)((long)&__return_storage_ptr__->field_0 + 8) = eVar4._M_cat;
    (__return_storage_ptr__->field_0).m_error.vk_result = VK_SUCCESS;
  }
  else {
    p_Var1 = (this->internal_table).fp_vkGetDeviceQueue;
    pVVar2 = this->device;
    puVar3 = Result<unsigned_int>::value(&RStack_38);
    (*p_Var1)(pVVar2,*puVar3,0,(VkQueue *)__return_storage_ptr__);
  }
  __return_storage_ptr__->m_init = RStack_38.m_init != false;
  return __return_storage_ptr__;
}

Assistant:

Result<VkQueue> Device::get_queue(QueueType type) const {
    auto index = get_queue_index(type);
    if (!index.has_value()) return { index.error() };
    VkQueue out_queue;
    internal_table.fp_vkGetDeviceQueue(device, index.value(), 0, &out_queue);
    return out_queue;
}